

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O0

gauden_t * gauden_init(char *meanfile,char *varfile,float32 varfloor,logmath_t *lmath)

{
  gauden_t *g_00;
  logmath_t *plVar1;
  float ****ppppfVar2;
  gauden_t *g;
  int32 *flen;
  int32 d;
  int32 f;
  int32 m;
  int32 i;
  logmath_t *lmath_local;
  char *pcStack_20;
  float32 varfloor_local;
  char *varfile_local;
  char *meanfile_local;
  
  _m = lmath;
  lmath_local._4_4_ = varfloor;
  pcStack_20 = varfile;
  varfile_local = meanfile;
  if (meanfile == (char *)0x0) {
    __assert_fail("meanfile != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                  ,0x13d,"gauden_t *gauden_init(const char *, const char *, float32, logmath_t *)");
  }
  if (varfile != (char *)0x0) {
    if ((float)varfloor <= 0.0) {
      __assert_fail("varfloor > 0.0",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                    ,0x13f,"gauden_t *gauden_init(const char *, const char *, float32, logmath_t *)"
                   );
    }
    g_00 = (gauden_t *)
           __ckd_calloc__(1,0x38,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                          ,0x141);
    plVar1 = logmath_retain(_m);
    g_00->lmath = plVar1;
    ppppfVar2 = gauden_param_read(varfile_local,&g_00->n_mgau,&g_00->n_feat,&g_00->n_density,
                                  &g_00->featlen);
    g_00->mean = (mfcc_t ****)ppppfVar2;
    if (g_00->mean == (mfcc_t ****)0x0) {
      meanfile_local = (char *)0x0;
    }
    else {
      ppppfVar2 = gauden_param_read(pcStack_20,&d,(int32 *)((long)&flen + 4),(int32 *)&flen,
                                    (int32 **)&g);
      g_00->var = (mfcc_t ****)ppppfVar2;
      if (g_00->var == (mfcc_t ****)0x0) {
        meanfile_local = (char *)0x0;
      }
      else if (((d == g_00->n_mgau) && (flen._4_4_ == g_00->n_feat)) &&
              ((int)flen == g_00->n_density)) {
        for (f = 0; f < g_00->n_feat; f = f + 1) {
          if (g_00->featlen[f] != *(int *)((long)&g->mean + (long)f * 4)) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                    ,0x158,"Feature lengths for means and variances differ\n");
            ckd_free(g);
            gauden_free(g_00);
            return (gauden_t *)0x0;
          }
        }
        ckd_free(g);
        gauden_dist_precompute(g_00,_m,lmath_local._4_4_);
        meanfile_local = (char *)g_00;
      }
      else {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                ,0x151,"Mixture-gaussians dimensions for means and variances differ\n");
        ckd_free(g);
        gauden_free(g_00);
        meanfile_local = (char *)0x0;
      }
    }
    return (gauden_t *)meanfile_local;
  }
  __assert_fail("varfile != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                ,0x13e,"gauden_t *gauden_init(const char *, const char *, float32, logmath_t *)");
}

Assistant:

gauden_t *
gauden_init(char const *meanfile, char const *varfile, float32 varfloor, logmath_t *lmath)
{
    int32 i, m, f, d, *flen;
    gauden_t *g;

    assert(meanfile != NULL);
    assert(varfile != NULL);
    assert(varfloor > 0.0);

    g = (gauden_t *) ckd_calloc(1, sizeof(gauden_t));
    g->lmath = logmath_retain(lmath);

    g->mean = (mfcc_t ****)gauden_param_read(meanfile, &g->n_mgau, &g->n_feat, &g->n_density,
                      &g->featlen);
    if (g->mean == NULL) {
	return NULL;
    }
    g->var = (mfcc_t ****)gauden_param_read(varfile, &m, &f, &d, &flen);
    if (g->var == NULL) {
	return NULL;
    }

    /* Verify mean and variance parameter dimensions */
    if ((m != g->n_mgau) || (f != g->n_feat) || (d != g->n_density)) {
        E_ERROR
            ("Mixture-gaussians dimensions for means and variances differ\n");
        ckd_free(flen);
        gauden_free(g);
        return NULL;
    }
    for (i = 0; i < g->n_feat; i++) {
        if (g->featlen[i] != flen[i]) {
            E_ERROR("Feature lengths for means and variances differ\n");
            ckd_free(flen);
            gauden_free(g);
            return NULL;
        }
    }

    ckd_free(flen);

    gauden_dist_precompute(g, lmath, varfloor);

    return g;
}